

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::writeLPF
          (SPxLPBase<double> *this,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames,
          DIdxSet *p_intvars,bool writeZeroObjective)

{
  ostream *this_00;
  DIdxSet *in_RDX;
  NameSet *in_RSI;
  ostream *in_RDI;
  undefined1 in_R9B;
  SPxLPBase<double> *unaff_retaddr;
  NameSet *in_stack_00000040;
  ostream *in_stack_00000048;
  SPxLPBase<double> *in_stack_00000050;
  NameSet *in_stack_00000088;
  NameSet *in_stack_00000090;
  ostream *in_stack_00000098;
  SPxLPBase<double> *in_stack_000000a0;
  undefined7 in_stack_ffffffffffffffd0;
  
  SPxOut::setScientific
            ((ostream *)(CONCAT17(in_R9B,in_stack_ffffffffffffffd0) & 0x1ffffffffffffff),
             (int)((ulong)in_RDI >> 0x20));
  LPFwriteObjective<double>(this,p_output,p_rnames,p_cnames._7_1_);
  LPFwriteRows<double>(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088);
  LPFwriteBounds<double>(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  LPFwriteGenerals<double>(unaff_retaddr,in_RDI,in_RSI,in_RDX);
  this_00 = std::operator<<((ostream *)in_RSI,"End");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

inline
void SPxLPBase<R>::writeLPF(
   std::ostream&  p_output,          ///< output stream
   const NameSet* p_rnames,          ///< row names
   const NameSet* p_cnames,          ///< column names
   const DIdxSet* p_intvars,         ///< integer variables
   const bool     writeZeroObjective ///< write zero objective coefficients
) const
{
   SPxOut::setScientific(p_output, 16);

   LPFwriteObjective(*this, p_output, p_cnames, writeZeroObjective);
   LPFwriteRows(*this, p_output, p_rnames, p_cnames);
   LPFwriteBounds(*this, p_output, p_cnames);
   LPFwriteGenerals(*this, p_output, p_cnames, p_intvars);

   p_output << "End" << std::endl;
}